

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::Matching(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
           *this,Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *graph,
          vector<double,_std::allocator<double>_> *costs,vector<int,_std::allocator<int>_> *mask)

{
  pointer pVVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  ulong local_38;
  
  this->graph_ = graph;
  this->costs_ = costs;
  this->mask_ = mask;
  (this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  this->step_ = ONE;
  (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cols_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cols_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cols_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->cols_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  (this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->path_).
  super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).
  super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).
  super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = 0;
  while( true ) {
    pVVar1 = (graph->vertices_).
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(graph->vertices_).
                      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 6) <= local_38)
    break;
    this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->cols_;
    if ((*(pointer *)((long)&pVVar1[local_38].from_.vector_ + 8) !=
         *(pointer *)&pVVar1[local_38].from_.vector_) ||
       (this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->rows_,
       *(pointer *)((long)&pVVar1[local_38].to_.vector_ + 8) !=
       *(pointer *)
        &pVVar1[local_38].to_.vector_.
         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
       )) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                (this_00,&local_38);
    }
    local_38 = local_38 + 1;
    graph = this->graph_;
  }
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->row_cover,
             (long)(this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,false);
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->col_cover,
             (long)(this->cols_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->cols_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,false);
  return;
}

Assistant:

Matching(GRAPH const& graph, COST& costs, MASK& mask)
      : graph_(graph)
      , costs_(costs)
      , mask_(mask)
    {
        for (size_t v = 0; v < graph_.numberOfVertices(); ++v) {
            if (graph_.numberOfEdgesToVertex(v) > 0)
                cols_.emplace_back(v);
            else if (graph_.numberOfEdgesFromVertex(v) > 0)
                rows_.emplace_back(v);
        }

        row_cover.resize(rows_.size(), false);
        col_cover.resize(cols_.size(), false);
    }